

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void new_token(Grammar *g,char *s,char *e)

{
  uint uVar1;
  Term *elem;
  char *pcVar2;
  Term *t;
  char *e_local;
  char *s_local;
  Grammar *g_local;
  
  elem = new_term();
  pcVar2 = (char *)malloc((size_t)(e + (1 - (long)s)));
  elem->string = pcVar2;
  memcpy(elem->string,s,(long)e - (long)s);
  elem->string[(long)e - (long)s] = '\0';
  elem->string_len = (int)e - (int)s;
  if ((g->terminals).v == (Term **)0x0) {
    (g->terminals).v = (g->terminals).e;
    uVar1 = (g->terminals).n;
    (g->terminals).n = uVar1 + 1;
    (g->terminals).e[uVar1] = elem;
  }
  else {
    if ((g->terminals).v == (g->terminals).e) {
      if ((g->terminals).n < 3) {
        uVar1 = (g->terminals).n;
        (g->terminals).n = uVar1 + 1;
        (g->terminals).v[uVar1] = elem;
        goto LAB_0013eb93;
      }
    }
    else if (((g->terminals).n & 7) != 0) {
      uVar1 = (g->terminals).n;
      (g->terminals).n = uVar1 + 1;
      (g->terminals).v[uVar1] = elem;
      goto LAB_0013eb93;
    }
    vec_add_internal(&g->terminals,elem);
  }
LAB_0013eb93:
  elem->kind = TERM_TOKEN;
  return;
}

Assistant:

void new_token(Grammar *g, char *s, char *e) {
  Term *t = new_term();
  t->string = MALLOC(e - s + 1);
  memcpy(t->string, s, e - s);
  t->string[e - s] = 0;
  t->string_len = e - s;
  vec_add(&g->terminals, t);
  t->kind = TERM_TOKEN;
}